

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O1

LY_ERR lyplg_type_validate_xpath10
                 (ly_ctx *UNUSED_ctx,lysc_type *UNUSED_type,lyd_node *ctx_node,lyd_node *UNUSED_tree
                 ,lyd_value *storage,ly_err_item **err)

{
  lysc_node *plVar1;
  lyd_node *plVar2;
  byte *pbVar3;
  ly_path_predicate *set_00;
  ly_err_item **err_00;
  int iVar4;
  LY_ERR LVar5;
  lysc_node **pplVar6;
  undefined8 *puVar7;
  char *pcVar8;
  lyd_node *plVar9;
  char *pcVar10;
  ly_err_item *plVar11;
  long lVar12;
  lys_module *plVar13;
  long lVar14;
  LY_ERR ecode;
  ly_path *plVar15;
  ulong uVar16;
  ly_set *set;
  ly_set *local_50;
  ly_err_item **local_48;
  lyd_node *local_40;
  ly_path *local_38;
  
  LVar5 = LY_SUCCESS;
  local_50 = (ly_set *)0x0;
  *err = (ly_err_item *)0x0;
  plVar15 = (storage->field_2).target;
  if (*(int *)&plVar15[1].node == 6) {
    if (plVar15->predicates == (ly_path_predicate *)0x0) {
      __assert_fail("val->prefix_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                    ,0x184,
                    "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                   );
    }
    plVar1 = ctx_node->schema;
    pplVar6 = (lysc_node **)&plVar1->name;
    if (plVar1 == (lysc_node *)0x0) {
      pplVar6 = &ctx_node[1].schema;
    }
    local_48 = err;
    iVar4 = strcmp((char *)*pplVar6,"parent-reference");
    if ((iVar4 != 0) || (iVar4 = strcmp(plVar1->module->name,"ietf-yang-schema-mount"), iVar4 != 0))
    {
      __assert_fail("!strcmp(LYD_NAME(ctx_node), \"parent-reference\") && !strcmp(ctx_node->schema->module->name, \"ietf-yang-schema-mount\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                    ,0x188,
                    "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                   );
    }
    local_40 = ctx_node;
    LVar5 = lyd_find_xpath(ctx_node,"../../../namespace",&local_50);
    if (LVar5 == LY_SUCCESS) {
      if (local_50->count != 0) {
        uVar16 = 0;
        local_38 = plVar15;
        do {
          plVar2 = (local_50->field_2).dnodes[uVar16];
          if (*(long *)(*(long *)(plVar2 + 1) + 8) == 0) {
            if ((plVar2->schema == (lysc_node *)0x0) || ((plVar2->schema->nodetype & 0x711) != 0)) {
              lVar12._0_4_ = plVar2[1].hash;
              lVar12._4_4_ = plVar2[1].flags;
            }
            else {
              lVar12 = 0;
            }
            puVar7 = (undefined8 *)(lVar12 + 0x40);
          }
          else {
            puVar7 = (undefined8 *)(*(long *)(*(long *)(plVar2 + 1) + 8) + 0x28);
          }
          iVar4 = strcmp((char *)*puVar7,"prefix");
          if (iVar4 != 0) {
            __assert_fail("!strcmp(LYD_NAME(lyd_child(set->dnodes[i])), \"prefix\")",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                          ,400,
                          "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                         );
          }
          if ((plVar2->schema == (lysc_node *)0x0) || ((plVar2->schema->nodetype & 0x711) != 0)) {
            lVar14._0_4_ = plVar2[1].hash;
            lVar14._4_4_ = plVar2[1].flags;
          }
          else {
            lVar14 = 0;
          }
          if (lVar14 == 0) {
LAB_001c4efc:
            pcVar8 = (char *)0x0;
          }
          else {
            pbVar3 = *(byte **)(lVar14 + 8);
            if (pbVar3 == (byte *)0x0) {
              pcVar8 = *(char **)(lVar14 + 0x58);
            }
            else {
              if ((*pbVar3 & 0xc) == 0) goto LAB_001c4efc;
              pcVar8 = *(char **)(lVar14 + 0x38);
              if (pcVar8 == (char *)0x0) {
                pcVar8 = lyd_value_get_canonical
                                   ((ly_ctx *)**(undefined8 **)(pbVar3 + 8),
                                    (lyd_value *)(lVar14 + 0x38));
              }
            }
          }
          plVar2 = (local_50->field_2).dnodes[uVar16];
          if (*(long *)(*(long *)(plVar2 + 1) + 0x18) != 0) {
            if (*(long *)(*(long *)(*(long *)(plVar2 + 1) + 0x18) + 8) == 0) {
              plVar9 = plVar2 + 1;
              lVar12 = 0x40;
              lVar14 = 0x18;
            }
            else {
              plVar9 = (lyd_node *)(*(long *)(plVar2 + 1) + 0x18);
              lVar12 = 0x28;
              lVar14 = 8;
            }
            iVar4 = strcmp(*(char **)(*(long *)(*(long *)plVar9 + lVar14) + lVar12),"uri");
            if (iVar4 != 0) {
              __assert_fail("!strcmp(LYD_NAME(lyd_child(set->dnodes[i])->next), \"uri\")",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                            ,0x197,
                            "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                           );
            }
            lVar12 = *(long *)(*(long *)(plVar2 + 1) + 0x18);
            if (lVar12 == 0) {
LAB_001c4fa9:
              pcVar10 = (char *)0x0;
            }
            else {
              pbVar3 = *(byte **)(lVar12 + 8);
              if (pbVar3 == (byte *)0x0) {
                pcVar10 = *(char **)(lVar12 + 0x58);
              }
              else {
                if ((*pbVar3 & 0xc) == 0) goto LAB_001c4fa9;
                pcVar10 = *(char **)(lVar12 + 0x38);
                if (pcVar10 == (char *)0x0) {
                  pcVar10 = lyd_value_get_canonical
                                      ((ly_ctx *)**(undefined8 **)(pbVar3 + 8),
                                       (lyd_value *)(lVar12 + 0x38));
                }
              }
            }
            set_00 = plVar15->predicates;
            puVar7 = (undefined8 *)calloc(1,0x18);
            LVar5 = LY_EMEM;
            if (puVar7 == (undefined8 *)0x0) {
              puVar7 = (undefined8 *)0x0;
            }
            else {
              pcVar8 = strdup(pcVar8);
              *puVar7 = pcVar8;
              pcVar10 = strdup(pcVar10);
              puVar7[1] = pcVar10;
              if ((pcVar8 != (char *)0x0) && (pcVar10 != (char *)0x0)) {
                *(undefined4 *)(puVar7 + 2) = 1;
                LVar5 = ly_set_add((ly_set *)set_00,puVar7,'\x01',(uint32_t *)0x0);
                if (LVar5 == LY_SUCCESS) {
                  puVar7 = (undefined8 *)0x0;
                }
              }
            }
            if (puVar7 != (undefined8 *)0x0) {
              free((void *)*puVar7);
              free((void *)puVar7[1]);
              free(puVar7);
            }
            plVar15 = local_38;
            if (LVar5 != LY_SUCCESS) goto LAB_001c5069;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_50->count);
      }
      LVar5 = LY_SUCCESS;
    }
LAB_001c5069:
    ly_set_free(local_50,(_func_void_void_ptr *)0x0);
    err_00 = local_48;
    if (LVar5 != LY_SUCCESS) {
      if (LVar5 == LY_EMEM) {
        pcVar10 = "Memory allocation failed.";
        pcVar8 = (char *)0x0;
        ecode = LY_EMEM;
      }
      else {
        if (local_40->schema == (lysc_node *)0x0) {
          plVar13 = (lys_module *)&local_40[2].schema;
        }
        else {
          plVar13 = local_40->schema->module;
        }
        plVar11 = ly_err_last(plVar13->ctx);
        pcVar8 = plVar11->data_path;
        pcVar10 = "%s";
        ecode = LVar5;
      }
      ly_err_new(err_00,ecode,LYVE_DATA,pcVar8,(char *)0x0,pcVar10);
    }
  }
  return LVar5;
}

Assistant:

static LY_ERR
lyplg_type_validate_xpath10(const struct ly_ctx *UNUSED(ctx), const struct lysc_type *UNUSED(type),
        const struct lyd_node *ctx_node, const struct lyd_node *UNUSED(tree), struct lyd_value *storage,
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_value_xpath10 *val;
    struct ly_set *set = NULL;
    uint32_t i;
    const char *pref, *uri;
    const struct ly_err_item *eitem;

    *err = NULL;
    LYD_VALUE_GET(storage, val);

    if (val->format != LY_VALUE_STR_NS) {
        /* nothing to validate */
        return LY_SUCCESS;
    }

    /* the XML namespace set must exist */
    assert(val->prefix_data);

    /* special handling of this particular node */
    assert(!strcmp(LYD_NAME(ctx_node), "parent-reference") &&
            !strcmp(ctx_node->schema->module->name, "ietf-yang-schema-mount"));

    /* get all the prefix mappings */
    if ((ret = lyd_find_xpath(ctx_node, "../../../namespace", &set))) {
        goto cleanup;
    }

    for (i = 0; i < set->count; ++i) {
        assert(!strcmp(LYD_NAME(lyd_child(set->dnodes[i])), "prefix"));
        pref = lyd_get_value(lyd_child(set->dnodes[i]));

        if (!lyd_child(set->dnodes[i])->next) {
            /* missing URI - invalid mapping, skip */
            continue;
        }
        assert(!strcmp(LYD_NAME(lyd_child(set->dnodes[i])->next), "uri"));
        uri = lyd_get_value(lyd_child(set->dnodes[i])->next);

        /* new NS */
        if ((ret = xpath10_add_ns(val->prefix_data, pref, uri))) {
            goto cleanup;
        }
    }

cleanup:
    ly_set_free(set, NULL);
    if (ret == LY_EMEM) {
        ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, LY_EMEM_MSG);
    } else if (ret) {
        eitem = ly_err_last(LYD_CTX(ctx_node));
        ly_err_new(err, ret, LYVE_DATA, eitem->data_path, NULL, "%s", eitem->msg);
    }
    return ret;
}